

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
* deqp::gls::BuiltinPrecisionTests::createES31BuiltinCases(void)

{
  BuiltinFuncs *pBVar1;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  *in_RDI;
  allocator<char> local_81;
  MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  funcs;
  string local_70;
  string local_50;
  string local_30;
  
  pBVar1 = (BuiltinFuncs *)operator_new(0x20);
  (pBVar1->super_CaseFactories)._vptr_CaseFactories = (_func_int **)&PTR__BuiltinFuncs_01e630b8;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  funcs.
  super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  .m_data.ptr = pBVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,glcts::fixed_sample_locations_values + 1,&local_81);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::FrExp>(pBVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_81);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::LdExp>(pBVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,glcts::fixed_sample_locations_values + 1,&local_81);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Fma>(pBVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  funcs.
  super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  .m_data.ptr = (BuiltinFuncs *)0x0;
  (in_RDI->
  super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ).m_data.ptr = &pBVar1->super_CaseFactories;
  de::details::
  UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  ::~UniqueBase(&funcs.
                 super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
               );
  return in_RDI;
}

Assistant:

MovePtr<const CaseFactories> createES31BuiltinCases (void)
{
	MovePtr<BuiltinFuncs>	funcs	(new BuiltinFuncs());

	addScalarFactory<FrExp>(*funcs);
	addScalarFactory<LdExp>(*funcs);
	addScalarFactory<Fma>(*funcs);

	return MovePtr<const CaseFactories>(funcs.release());
}